

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O1

void __thiscall
duckdb::ColumnData::GetColumnSegmentInfo
          (ColumnData *this,idx_t row_group_index,vector<unsigned_long,_true> *col_path,
          vector<duckdb::ColumnSegmentInfo,_true> *result)

{
  ulong __val;
  CompressionFunction *pCVar1;
  pointer pcVar2;
  bool bVar3;
  undefined8 uVar4;
  pointer plVar5;
  char cVar6;
  int iVar7;
  reference pvVar8;
  __pointer_type pCVar9;
  ulong uVar10;
  CompressionType extraout_DL;
  CompressionType extraout_DL_00;
  CompressionType type;
  size_type __n;
  pointer ppVar11;
  char cVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  optional_ptr<duckdb::CompressedSegmentState,_true> segment_state;
  InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  segment_info;
  string col_path_str;
  string __str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  sinfo;
  _Head_base<0UL,_duckdb::CompressedSegmentState_*,_false> local_2a8;
  ColumnData *local_2a0;
  ColumnSegment *local_298;
  pthread_mutex_t *local_290;
  vector<unsigned_long,_true> *local_288;
  idx_t local_280;
  undefined1 local_278 [88];
  undefined1 *local_220 [2];
  undefined1 local_210 [16];
  undefined1 local_200 [16];
  _Alloc_hider local_1f0;
  size_type local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  idx_t local_1d0;
  _Alloc_hider local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  idx_t local_1a8;
  __int_type local_1a0;
  _Alloc_hider local_198;
  size_type local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  _Alloc_hider local_178;
  size_type local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  bool local_158;
  bool local_157;
  block_id_t local_150;
  pointer local_148;
  pointer ppStack_140;
  pointer local_138;
  idx_t local_130;
  _Alloc_hider local_128;
  size_type local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_108;
  LogicalType *local_e8;
  vector<duckdb::ColumnSegmentInfo,std::allocator<duckdb::ColumnSegmentInfo>> *local_e0;
  _Alloc_hider *local_d8;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  local_220[0] = local_210;
  local_2a0 = this;
  local_e0 = (vector<duckdb::ColumnSegmentInfo,std::allocator<duckdb::ColumnSegmentInfo>> *)result;
  local_d8 = (_Alloc_hider *)row_group_index;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"[","");
  local_288 = col_path;
  if ((col_path->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (col_path->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      if (__n != 0) {
        ::std::__cxx11::string::append((char *)local_220);
      }
      pvVar8 = vector<unsigned_long,_true>::operator[](local_288,__n);
      __val = *pvVar8;
      cVar12 = '\x01';
      if (9 < __val) {
        uVar10 = __val;
        cVar6 = '\x04';
        do {
          cVar12 = cVar6;
          if (uVar10 < 100) {
            cVar12 = cVar12 + -2;
            goto LAB_0060b5ec;
          }
          if (uVar10 < 1000) {
            cVar12 = cVar12 + -1;
            goto LAB_0060b5ec;
          }
          if (uVar10 < 10000) goto LAB_0060b5ec;
          bVar3 = 99999 < uVar10;
          uVar10 = uVar10 / 10000;
          cVar6 = cVar12 + '\x04';
        } while (bVar3);
        cVar12 = cVar12 + '\x01';
      }
LAB_0060b5ec:
      local_200._0_8_ = &local_1f0;
      ::std::__cxx11::string::_M_construct((ulong)local_200,cVar12);
      ::std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)local_200._0_8_,local_200._8_4_,__val);
      ::std::__cxx11::string::_M_append((char *)local_220,local_200._0_8_);
      if ((_Alloc_hider *)local_200._0_8_ != &local_1f0) {
        operator_delete((void *)local_200._0_8_);
      }
      __n = __n + 1;
    } while (__n < (ulong)((long)(local_288->
                                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)(local_288->
                                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  ::std::__cxx11::string::append((char *)local_220);
  pCVar9 = SegmentTree<duckdb::ColumnSegment,_false>::GetRootSegment
                     (&(local_2a0->data).super_SegmentTree<duckdb::ColumnSegment,_false>);
  if (pCVar9 != (ColumnSegment *)0x0) {
    local_e8 = &local_2a0->type;
    local_290 = (pthread_mutex_t *)&local_2a0->stats_lock;
    local_280 = 0;
    do {
      local_1f0._M_p = (pointer)&local_1e0;
      local_1e8 = 0;
      local_1e0._M_local_buf[0] = '\0';
      local_1c8._M_p = (pointer)&local_1b8;
      local_1c0 = 0;
      local_1b8._M_local_buf[0] = '\0';
      local_198._M_p = (pointer)&local_188;
      local_190 = 0;
      local_188._M_local_buf[0] = '\0';
      local_178._M_p = (pointer)&local_168;
      local_170 = 0;
      local_168._M_local_buf[0] = '\0';
      local_138 = (pointer)0x0;
      local_148 = (pointer)0x0;
      ppStack_140 = (pointer)0x0;
      local_128._M_p = (pointer)&local_118;
      local_120 = 0;
      local_118._M_local_buf[0] = '\0';
      local_200._0_8_ = local_d8;
      pvVar8 = vector<unsigned_long,_true>::operator[](local_288,0);
      local_200._8_8_ = *pvVar8;
      ::std::__cxx11::string::_M_assign((string *)&local_1f0);
      local_1d0 = local_280;
      LogicalType::ToString_abi_cxx11_((string *)local_278,local_e8);
      ::std::__cxx11::string::operator=((string *)&local_1c8,(string *)local_278);
      type = extraout_DL;
      if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
        operator_delete((void *)local_278._0_8_);
        type = extraout_DL_00;
      }
      local_1a8 = (pCVar9->super_SegmentBase<duckdb::ColumnSegment>).start;
      local_1a0 = (pCVar9->super_SegmentBase<duckdb::ColumnSegment>).count.
                  super___atomic_base<unsigned_long>._M_i;
      CompressionTypeToString_abi_cxx11_
                ((string *)local_278,(duckdb *)(ulong)((pCVar9->function)._M_data)->type,type);
      ::std::__cxx11::string::operator=((string *)&local_198,(string *)local_278);
      if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
        operator_delete((void *)local_278._0_8_);
      }
      iVar7 = pthread_mutex_lock(local_290);
      if (iVar7 != 0) {
        ::std::__throw_system_error(iVar7);
      }
      BaseStatistics::ToString_abi_cxx11_((string *)local_278,&(pCVar9->stats).statistics);
      ::std::__cxx11::string::operator=((string *)&local_178,(string *)local_278);
      if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
        operator_delete((void *)local_278._0_8_);
      }
      pthread_mutex_unlock(local_290);
      local_158 = HasUpdates(local_2a0);
      local_157 = pCVar9->segment_type == PERSISTENT;
      if (local_157) {
        local_150 = pCVar9->block_id;
        local_130 = pCVar9->offset;
      }
      local_298 = (ColumnSegment *)(pCVar9->function)._M_data;
      local_2a8._M_head_impl =
           (pCVar9->segment_state).
           super_unique_ptr<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::CompressedSegmentState_*,_std::default_delete<duckdb::CompressedSegmentState>_>
           .super__Head_base<0UL,_duckdb::CompressedSegmentState_*,_false>._M_head_impl;
      if (local_2a8._M_head_impl != (CompressedSegmentState *)0x0) {
        optional_ptr<duckdb::CompressedSegmentState,_true>::CheckValid
                  ((optional_ptr<duckdb::CompressedSegmentState,_true> *)&local_2a8);
        (*(local_2a8._M_head_impl)->_vptr_CompressedSegmentState[2])((string *)local_278);
        ::std::__cxx11::string::operator=((string *)&local_128,(string *)local_278);
        if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
          operator_delete((void *)local_278._0_8_);
        }
        optional_ptr<duckdb::CompressedSegmentState,_true>::CheckValid
                  ((optional_ptr<duckdb::CompressedSegmentState,_true> *)&local_2a8);
        (*(local_2a8._M_head_impl)->_vptr_CompressedSegmentState[3])(local_278);
        plVar5 = local_148;
        local_148 = (pointer)local_278._0_8_;
        ppStack_140 = (pointer)local_278._8_8_;
        local_138 = (pointer)local_278._16_8_;
        local_278._0_8_ = (pointer)0x0;
        local_278._8_8_ = (pointer)0x0;
        local_278._16_8_ = 0;
        if (plVar5 != (pointer)0x0) {
          operator_delete(plVar5);
        }
        if ((pointer)local_278._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_278._0_8_);
        }
      }
      pCVar1 = (local_298->function)._M_data;
      if (pCVar1 != (CompressionFunction *)0x0) {
        local_298 = pCVar9;
        (*(code *)pCVar1)(local_278,pCVar9);
        uVar4 = local_278._8_8_;
        local_108.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_108.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_108.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        for (ppVar11 = (pointer)local_278._0_8_; ppVar11 != (pointer)uVar4; ppVar11 = ppVar11 + 1) {
          local_70[0] = local_60;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"%s: %s","");
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          pcVar2 = (ppVar11->first)._M_dataplus._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_90,pcVar2,pcVar2 + (ppVar11->first)._M_string_length);
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          pcVar2 = (ppVar11->second)._M_dataplus._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,pcVar2,pcVar2 + (ppVar11->second)._M_string_length);
          StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
                    (&local_50,(StringUtil *)local_70,&local_90,&local_b0,in_R8);
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_108
                     ,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p);
          }
          if (local_70[0] != local_60) {
            operator_delete(local_70[0]);
          }
        }
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,", ","");
        StringUtil::Join(&local_50,&local_108,&local_d0);
        pCVar9 = local_298;
        ::std::__cxx11::string::operator=((string *)&local_128,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_108);
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)(local_278 + 0x18));
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_278);
      }
      ::std::vector<duckdb::ColumnSegmentInfo,std::allocator<duckdb::ColumnSegmentInfo>>::
      emplace_back<duckdb::ColumnSegmentInfo&>(local_e0,(ColumnSegmentInfo *)local_200);
      pCVar9 = (pCVar9->super_SegmentBase<duckdb::ColumnSegment>).next._M_b._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_p != &local_118) {
        operator_delete(local_128._M_p);
      }
      if (local_148 != (pointer)0x0) {
        operator_delete(local_148);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_p != &local_168) {
        operator_delete(local_178._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_p != &local_188) {
        operator_delete(local_198._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_p != &local_1b8) {
        operator_delete(local_1c8._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_p != &local_1e0) {
        operator_delete(local_1f0._M_p);
      }
      local_280 = local_280 + 1;
    } while (pCVar9 != (__pointer_type)0x0);
  }
  if (local_220[0] != local_210) {
    operator_delete(local_220[0]);
  }
  return;
}

Assistant:

void ColumnData::GetColumnSegmentInfo(idx_t row_group_index, vector<idx_t> col_path,
                                      vector<ColumnSegmentInfo> &result) {
	D_ASSERT(!col_path.empty());

	// convert the column path to a string
	string col_path_str = "[";
	for (idx_t i = 0; i < col_path.size(); i++) {
		if (i > 0) {
			col_path_str += ", ";
		}
		col_path_str += to_string(col_path[i]);
	}
	col_path_str += "]";

	// iterate over the segments
	idx_t segment_idx = 0;
	auto segment = data.GetRootSegment();
	while (segment) {
		ColumnSegmentInfo column_info;
		column_info.row_group_index = row_group_index;
		column_info.column_id = col_path[0];
		column_info.column_path = col_path_str;
		column_info.segment_idx = segment_idx;
		column_info.segment_type = type.ToString();
		column_info.segment_start = segment->start;
		column_info.segment_count = segment->count;
		column_info.compression_type = CompressionTypeToString(segment->GetCompressionFunction().type);
		{
			lock_guard<mutex> l(stats_lock);
			column_info.segment_stats = segment->stats.statistics.ToString();
		}
		column_info.has_updates = ColumnData::HasUpdates();
		// persistent
		// block_id
		// block_offset
		if (segment->segment_type == ColumnSegmentType::PERSISTENT) {
			column_info.persistent = true;
			column_info.block_id = segment->GetBlockId();
			column_info.block_offset = segment->GetBlockOffset();
		} else {
			column_info.persistent = false;
		}
		auto &compression_function = segment->GetCompressionFunction();
		auto segment_state = segment->GetSegmentState();
		if (segment_state) {
			column_info.segment_info = segment_state->GetSegmentInfo();
			column_info.additional_blocks = segment_state->GetAdditionalBlocks();
		}
		if (compression_function.get_segment_info) {
			auto segment_info = compression_function.get_segment_info(*segment);
			vector<string> sinfo;
			for (auto &item : segment_info) {
				auto &mode = item.first;
				auto &count = item.second;
				sinfo.push_back(StringUtil::Format("%s: %s", mode, count));
			}
			column_info.segment_info = StringUtil::Join(sinfo, ", ");
		}
		result.emplace_back(column_info);

		segment_idx++;
		segment = data.GetNextSegment(segment);
	}
}